

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_throttle_all_channels(ConnectionLayer *cl,_Bool throttled)

{
  ssh2_channel *c;
  int index;
  
  *(_Bool *)&cl[-8].vt = throttled;
  index = 0;
  while( true ) {
    c = (ssh2_channel *)index234((tree234 *)cl[-8].logctx,index);
    if (c == (ssh2_channel *)0x0) break;
    if (c->sharectx == (ssh_sharing_connstate *)0x0) {
      ssh2_channel_check_throttle(c);
    }
    index = index + 1;
  }
  return;
}

Assistant:

static void ssh2_throttle_all_channels(ConnectionLayer *cl, bool throttled)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh2_channel *c;
    int i;

    s->all_channels_throttled = throttled;

    for (i = 0; NULL != (c = index234(s->channels, i)); i++)
        if (!c->sharectx)
            ssh2_channel_check_throttle(c);
}